

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

bool __thiscall QItemSelectionModel::isSelected(QItemSelectionModel *this,QModelIndex *index)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  QItemSelectionRange *pQVar1;
  long lVar2;
  QAbstractItemModel *pQVar3;
  bool bVar4;
  uint uVar5;
  parameter_type pQVar6;
  long lVar7;
  QItemSelectionRange *this_01;
  QItemSelectionRange *pQVar8;
  long lVar9;
  QItemSelection *this_02;
  
  lVar2 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             *)(lVar2 + 0x78);
  pQVar6 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value(this_00);
  if (pQVar6 != (index->m).ptr) {
    return false;
  }
  if (pQVar6 == (parameter_type)0x0) {
    return false;
  }
  if (index->r < 0) {
    return false;
  }
  if (index->c < 0) {
    return false;
  }
  this_01 = *(QItemSelectionRange **)(lVar2 + 0x88);
  lVar9 = *(long *)(lVar2 + 0x90);
  lVar7 = lVar9 * 0x10;
  pQVar1 = this_01 + lVar9;
  if (0 < lVar9 >> 2) {
    lVar9 = (lVar9 >> 2) + 1;
    do {
      bVar4 = QItemSelectionRange::contains(this_01,index);
      pQVar8 = this_01;
      if (bVar4) goto LAB_0045ecf6;
      bVar4 = QItemSelectionRange::contains(this_01 + 1,index);
      pQVar8 = this_01 + 1;
      if (bVar4) goto LAB_0045ecf6;
      bVar4 = QItemSelectionRange::contains(this_01 + 2,index);
      pQVar8 = this_01 + 2;
      if (bVar4) goto LAB_0045ecf6;
      bVar4 = QItemSelectionRange::contains(this_01 + 3,index);
      pQVar8 = this_01 + 3;
      if (bVar4) goto LAB_0045ecf6;
      this_01 = this_01 + 4;
      lVar9 = lVar9 + -1;
      lVar7 = lVar7 + -0x40;
    } while (1 < lVar9);
    lVar9 = lVar7 >> 4;
  }
  if (lVar9 == 1) {
LAB_0045ecdf:
    bVar4 = QItemSelectionRange::contains(this_01,index);
    pQVar8 = this_01;
    if (!bVar4) {
      pQVar8 = pQVar1;
    }
  }
  else if (lVar9 == 2) {
LAB_0045ecbf:
    bVar4 = QItemSelectionRange::contains(this_01,index);
    pQVar8 = this_01;
    if (!bVar4) {
      this_01 = this_01 + 1;
      goto LAB_0045ecdf;
    }
  }
  else {
    pQVar8 = pQVar1;
    if ((lVar9 == 3) &&
       (bVar4 = QItemSelectionRange::contains(this_01,index), pQVar8 = this_01, !bVar4)) {
      this_01 = this_01 + 1;
      goto LAB_0045ecbf;
    }
  }
LAB_0045ecf6:
  if (*(long *)(lVar2 + 0xa8) != 0) {
    uVar5 = *(uint *)(lVar2 + 0xb8);
    this_02 = (QItemSelection *)(lVar2 + 0x98);
    if ((pQVar8 != pQVar1) && ((uVar5 & 4) != 0)) {
      bVar4 = QItemSelection::contains(this_02,index);
      if (bVar4) {
        return false;
      }
      goto LAB_0045ed77;
    }
    if ((uVar5 & 8) != 0) {
      bVar4 = QItemSelection::contains(this_02,index);
      if (bVar4 == (pQVar8 != pQVar1)) {
        return false;
      }
      goto LAB_0045ed77;
    }
    if ((pQVar8 == pQVar1) && ((uVar5 & 2) != 0)) {
      bVar4 = QItemSelection::contains(this_02,index);
      if (!bVar4) {
        return false;
      }
      goto LAB_0045ed77;
    }
  }
  if (pQVar8 == pQVar1) {
    return false;
  }
LAB_0045ed77:
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::value(this_00);
  pQVar3 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
  uVar5 = (*(pQVar3->super_QObject)._vptr_QObject[0x27])(pQVar3,index);
  return (~uVar5 & 0x21) == 0;
}

Assistant:

bool QItemSelectionModel::isSelected(const QModelIndex &index) const
{
    Q_D(const QItemSelectionModel);
    if (d->model != index.model() || !index.isValid())
        return false;

    //  search model ranges
    auto contains = [](const auto &index) {
        return [&index](const auto &range) { return range.contains(index); };
    };
    bool selected = std::any_of(d->ranges.begin(), d->ranges.end(), contains(index));

    // check  currentSelection
    if (d->currentSelection.size()) {
        if ((d->currentCommand & Deselect) && selected)
            selected = !d->currentSelection.contains(index);
        else if (d->currentCommand & Toggle)
            selected ^= d->currentSelection.contains(index);
        else if ((d->currentCommand & Select) && !selected)
            selected = d->currentSelection.contains(index);
    }

    if (selected)
        return isSelectableAndEnabled(d->model->flags(index));

    return false;
}